

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O2

void Abc_EnumPrint_rec(Vec_Int_t *vGates,int i,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  iVar1 = Vec_IntEntry(vGates,i * 2);
  iVar2 = Vec_IntEntry(vGates,i * 2 + 1);
  pcVar4 = "+";
  if (iVar1 < iVar2) {
    pcVar4 = "";
  }
  iVar3 = iVar2;
  if (iVar2 < iVar1) {
    iVar3 = iVar1;
  }
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  if (iVar2 < nVars) {
    iVar2 = iVar2 + 0x61;
  }
  else {
    putchar(0x28);
    Abc_EnumPrint_rec(vGates,iVar2,nVars);
    iVar2 = 0x29;
  }
  putchar(iVar2);
  printf("%s",pcVar4);
  if (iVar3 < nVars) {
    iVar3 = iVar3 + 0x61;
  }
  else {
    putchar(0x28);
    Abc_EnumPrint_rec(vGates,iVar3,nVars);
    iVar3 = 0x29;
  }
  putchar(iVar3);
  return;
}

Assistant:

void Abc_EnumPrint_rec( Vec_Int_t * vGates, int i, int nVars )
{
    int Fan0 = Vec_IntEntry(vGates, 2*i);
    int Fan1 = Vec_IntEntry(vGates, 2*i+1);
    char * pOper = (char*)(Fan0 < Fan1 ? "" : "+");
    if ( Fan0 > Fan1 )
        ABC_SWAP( int, Fan0, Fan1 );
    if ( Fan0 < nVars )
        printf( "%c", 'a'+Fan0 );
    else
    {
        printf( "(" );
        Abc_EnumPrint_rec( vGates, Fan0, nVars );
        printf( ")" );
    }
    printf( "%s", pOper );
    if ( Fan1 < nVars )
        printf( "%c", 'a'+Fan1 );
    else
    {
        printf( "(" );
        Abc_EnumPrint_rec( vGates, Fan1, nVars );
        printf( ")" );
    }
}